

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i alVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  parasail_result_t *ppVar24;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  uint uVar25;
  int iVar26;
  long lVar27;
  char *pcVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  char *__format;
  size_t sVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  size_t __n;
  int iVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar44 [32];
  __m256i alVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 in_ZMM15 [64];
  undefined4 in_stack_fffffffffffffcf8;
  __m256i *ptr_05;
  __m256i *ptr_06;
  __m256i *ptr_07;
  int local_2cc;
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_1d8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar28 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar28 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar28 = "profile->matrix";
      }
      else {
        uVar23 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar28 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar28 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar28 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar28 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar8 = (profile->profile32).matches;
            iVar36 = ppVar7->min;
            uVar25 = 0x80000000 - iVar36;
            if (iVar36 != -open && SBORROW4(iVar36,-open) == iVar36 + open < 0) {
              uVar25 = open | 0x80000000;
            }
            pvVar9 = (profile->profile32).similar;
            iVar36 = 0x7ffffffe - ppVar7->max;
            ppVar24 = parasail_result_new_stats();
            if (ppVar24 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            local_1d8._0_4_ = s2Len;
            uVar35 = uVar23 + 7 >> 3;
            ppVar24->flag = ppVar24->flag | 0x8410404;
            b = parasail_memalign___m256i(0x20,uVar35);
            b_00 = parasail_memalign___m256i(0x20,uVar35);
            b_01 = parasail_memalign___m256i(0x20,uVar35);
            b_02 = parasail_memalign___m256i(0x20,uVar35);
            b_03 = parasail_memalign___m256i(0x20,uVar35);
            b_04 = parasail_memalign___m256i(0x20,uVar35);
            b_05 = parasail_memalign___m256i(0x20,uVar35);
            b_06 = parasail_memalign___m256i(0x20,uVar35);
            ptr = parasail_memalign___m256i(0x20,uVar35);
            ptr_00 = parasail_memalign___m256i(0x20,uVar35);
            ptr_01 = parasail_memalign___m256i(0x20,uVar35);
            ptr_02 = parasail_memalign___m256i(0x20,uVar35);
            ptr_03 = parasail_memalign___m256i(0x20,uVar35);
            ptr_04 = parasail_memalign___m256i(0x20,uVar35);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = b;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b_00;
            auVar43 = vpunpcklqdq_avx(auVar43,auVar48);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = b_01;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = b_02;
            auVar48 = vpunpcklqdq_avx(auVar38,auVar41);
            auVar38 = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar43;
            auVar41 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_03;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_04;
            auVar43 = vpunpcklqdq_avx(auVar42,auVar49);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = b_05;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_06;
            auVar48 = vpunpcklqdq_avx(auVar50,auVar52);
            auVar43 = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar43;
            auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39._0_8_ = -(ulong)(auVar38._0_8_ == 0);
            auVar39._8_8_ = -(ulong)(auVar38._8_8_ == 0);
            auVar39._16_8_ = -(ulong)(auVar41._0_8_ == 0);
            auVar39._24_8_ = -(ulong)(auVar41._8_8_ == 0);
            auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
            auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
            auVar44._16_8_ = -(ulong)(auVar48._0_8_ == 0);
            auVar44._24_8_ = -(ulong)(auVar48._8_8_ == 0);
            auVar39 = vpackssdw_avx2(auVar39,auVar44);
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0x7f,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0xbf,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar39[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_04 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar21 = uVar25 + 1;
            uVar34 = (uint)uVar35;
            auVar46._4_4_ = uVar34;
            auVar46._0_4_ = uVar34;
            auVar46._8_4_ = uVar34;
            auVar46._12_4_ = uVar34;
            auVar46._16_4_ = uVar34;
            auVar46._20_4_ = uVar34;
            auVar46._24_4_ = uVar34;
            auVar46._28_4_ = uVar34;
            auVar18 = vperm2i128_avx2(auVar46,auVar46,0x28);
            iVar30 = -(gap * uVar34);
            auVar40._4_4_ = iVar30;
            auVar40._0_4_ = iVar30;
            auVar40._8_4_ = iVar30;
            auVar40._12_4_ = iVar30;
            auVar40._16_4_ = iVar30;
            auVar40._20_4_ = iVar30;
            auVar40._24_4_ = iVar30;
            auVar40._28_4_ = iVar30;
            auVar39 = vpblendd_avx2(auVar40,ZEXT1632((undefined1  [16])0x0),1);
            auVar40 = ZEXT1632(CONCAT124(SUB6412(ZEXT1664((undefined1  [16])0x0),4),iVar21));
            auVar39 = vpaddd_avx2(auVar40,auVar39);
            alVar17[0]._4_4_ = iVar21;
            alVar17[0]._0_4_ = in_stack_fffffffffffffcf8;
            alVar17[1] = (longlong)b_01;
            alVar17[2] = (longlong)b_00;
            alVar17[3] = (longlong)b;
            iVar30 = iVar21;
            parasail_memset___m256i(b_03,alVar17,uVar35);
            alVar1[0]._4_4_ = iVar30;
            alVar1[0]._0_4_ = in_stack_fffffffffffffcf8;
            alVar1[1] = (longlong)b_01;
            alVar1[2] = (longlong)b_00;
            alVar1[3] = (longlong)b;
            parasail_memset___m256i(b_04,alVar1,uVar35);
            alVar2[0]._4_4_ = iVar30;
            alVar2[0]._0_4_ = in_stack_fffffffffffffcf8;
            alVar2[1] = (longlong)b_01;
            alVar2[2] = (longlong)b_00;
            alVar2[3] = (longlong)b;
            parasail_memset___m256i(b_05,alVar2,uVar35);
            c[0]._4_4_ = iVar30;
            c[0]._0_4_ = in_stack_fffffffffffffcf8;
            c[1] = (longlong)b_01;
            c[2] = (longlong)b_00;
            c[3] = (longlong)b;
            parasail_memset___m256i(b_06,c,uVar35);
            c_00[0]._4_4_ = iVar30;
            c_00[0]._0_4_ = in_stack_fffffffffffffcf8;
            c_00[1] = (longlong)b_01;
            c_00[2] = (longlong)b_00;
            c_00[3] = (longlong)b;
            parasail_memset___m256i(b,c_00,uVar35);
            c_01[0]._4_4_ = iVar30;
            c_01[0]._0_4_ = in_stack_fffffffffffffcf8;
            c_01[1] = (longlong)b_01;
            c_01[2] = (longlong)b_00;
            c_01[3] = (longlong)b;
            parasail_memset___m256i(b_00,c_01,uVar35);
            c_02[0]._4_4_ = iVar30;
            c_02[0]._0_4_ = in_stack_fffffffffffffcf8;
            c_02[1] = (longlong)b_01;
            c_02[2] = (longlong)b_00;
            c_02[3] = (longlong)b;
            parasail_memset___m256i(b_01,c_02,uVar35);
            c_03[0]._4_4_ = iVar30;
            c_03[0]._0_4_ = in_stack_fffffffffffffcf8;
            c_03[1] = (longlong)b_01;
            c_03[2] = (longlong)b_00;
            c_03[3] = (longlong)b;
            parasail_memset___m256i(b_02,c_03,uVar35);
            auVar19._4_4_ = open;
            auVar19._0_4_ = open;
            auVar19._8_4_ = open;
            auVar19._12_4_ = open;
            auVar19._16_4_ = open;
            auVar19._20_4_ = open;
            auVar19._24_4_ = open;
            auVar19._28_4_ = open;
            alVar17 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
            uVar22 = uVar34 - 1;
            alVar45[1]._0_4_ = 1;
            alVar45[0] = 0x100000001;
            alVar45[1]._4_4_ = 1;
            alVar45[2]._0_4_ = 1;
            alVar45[2]._4_4_ = 1;
            alVar45[3]._0_4_ = 1;
            alVar45[3]._4_4_ = 1;
            auVar44 = vpcmpeqd_avx2(auVar51,auVar51);
            for (uVar25 = uVar22; -1 < (int)uVar25; uVar25 = uVar25 - 1) {
              ptr_03[uVar25] = alVar17;
              ptr_04[uVar25] = alVar45;
              auVar51._4_4_ = gap;
              auVar51._0_4_ = gap;
              auVar51._8_4_ = gap;
              auVar51._12_4_ = gap;
              auVar51._16_4_ = gap;
              auVar51._20_4_ = gap;
              auVar51._24_4_ = gap;
              auVar51._28_4_ = gap;
              alVar17 = (__m256i)vpsubd_avx2((undefined1  [32])alVar17,auVar51);
              alVar45 = (__m256i)vpsubd_avx2((undefined1  [32])alVar45,auVar44);
            }
            auVar44 = vpalignr_avx2(auVar46,auVar18,0xc);
            __n = uVar35 << 5;
            auVar16._4_4_ = iVar36;
            auVar16._0_4_ = iVar36;
            auVar16._8_4_ = iVar36;
            auVar16._12_4_ = iVar36;
            auVar16._16_4_ = iVar36;
            auVar16._20_4_ = iVar36;
            auVar16._24_4_ = iVar36;
            auVar16._28_4_ = iVar36;
            auVar18._4_4_ = iVar21;
            auVar18._0_4_ = iVar21;
            auVar18._8_4_ = iVar21;
            auVar18._12_4_ = iVar21;
            auVar18._16_4_ = iVar21;
            auVar18._20_4_ = iVar21;
            auVar18._24_4_ = iVar21;
            auVar18._28_4_ = iVar21;
            local_2cc = 0;
            auVar51 = auVar18;
            ptr_05 = b_01;
            ptr_06 = b_00;
            ptr_07 = b;
            local_d8 = auVar18;
            for (uVar35 = 0; uVar35 != (uint)s2Len; uVar35 = uVar35 + 1) {
              alVar17 = b_03[uVar22];
              alVar45 = b_04[uVar22];
              alVar1 = b_05[uVar22];
              alVar2 = b_06[uVar22];
              auVar19 = vperm2i128_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17,0x28);
              auVar19 = vpalignr_avx2((undefined1  [32])alVar17,auVar19,0xc);
              auVar46 = vperm2i128_avx2((undefined1  [32])alVar45,(undefined1  [32])alVar45,0x28);
              auVar46 = vpalignr_avx2((undefined1  [32])alVar45,auVar46,0xc);
              auVar47 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar47 = vpalignr_avx2((undefined1  [32])alVar1,auVar47,0xc);
              auVar20 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar20 = vpalignr_avx2((undefined1  [32])alVar2,auVar20,0xc);
              lVar27 = (long)(int)(ppVar7->mapper[(byte)s2[uVar35]] * uVar34) * 0x20;
              local_248 = ZEXT1632(ZEXT816(0));
              auVar55 = ZEXT1664((undefined1  [16])0x0);
              sVar32 = 0;
              auVar15._4_4_ = iVar21;
              auVar15._0_4_ = iVar21;
              auVar15._8_4_ = iVar21;
              auVar15._12_4_ = iVar21;
              auVar15._16_4_ = iVar21;
              auVar15._20_4_ = iVar21;
              auVar15._24_4_ = iVar21;
              auVar15._28_4_ = iVar21;
              local_288 = ZEXT1632(ZEXT816(0));
              local_268 = ZEXT1632(ZEXT816(0));
              while( true ) {
                auVar54 = auVar55._0_32_;
                auVar56 = in_ZMM15._0_32_;
                if (__n == sVar32) break;
                auVar3 = *(undefined1 (*) [32])((long)*b_03 + sVar32);
                auVar53 = *(undefined1 (*) [32])((long)*b_04 + sVar32);
                auVar4 = *(undefined1 (*) [32])((long)*b_05 + sVar32);
                auVar5 = *(undefined1 (*) [32])((long)*b_06 + sVar32);
                auVar10 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])((long)*ptr_03 + sVar32));
                auVar12 = vpcmpgtd_avx2(auVar10,auVar15);
                local_248 = vblendvps_avx(local_248,auVar56,auVar12);
                local_288 = vblendvps_avx(local_288,local_b8,auVar12);
                auVar54 = vpaddd_avx2(local_1d8,*(undefined1 (*) [32])((long)*ptr_04 + sVar32));
                local_268 = vblendvps_avx(local_268,auVar54,auVar12);
                auVar54._4_4_ = open;
                auVar54._0_4_ = open;
                auVar54._8_4_ = open;
                auVar54._12_4_ = open;
                auVar54._16_4_ = open;
                auVar54._20_4_ = open;
                auVar54._24_4_ = open;
                auVar54._28_4_ = open;
                auVar54 = vpsubd_avx2(auVar3,auVar54);
                auVar56._4_4_ = gap;
                auVar56._0_4_ = gap;
                auVar56._8_4_ = gap;
                auVar56._12_4_ = gap;
                auVar56._16_4_ = gap;
                auVar56._20_4_ = gap;
                auVar56._24_4_ = gap;
                auVar56._28_4_ = gap;
                auVar56 = vpsubd_avx2(*(undefined1 (*) [32])((long)*b + sVar32),auVar56);
                auVar13 = vpcmpgtd_avx2(auVar54,auVar56);
                auVar14 = vpmaxsd_avx2(auVar54,auVar56);
                auVar54 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + sVar32),auVar53,auVar13
                                       );
                auVar56 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + sVar32),auVar4,auVar13)
                ;
                auVar12 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + sVar32),auVar5,auVar13)
                ;
                auVar11 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])((long)pvVar6 + sVar32 + lVar27)
                                     );
                auVar46 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])((long)pvVar8 + sVar32 + lVar27)
                                     );
                auVar47 = vpaddd_avx2(auVar47,*(undefined1 (*) [32])((long)pvVar9 + sVar32 + lVar27)
                                     );
                auVar19 = vpcmpeqd_avx2(auVar13,auVar13);
                auVar13 = vpsubd_avx2(auVar20,auVar19);
                auVar12 = vpsubd_avx2(auVar12,auVar19);
                auVar15 = vpmaxsd_avx2(auVar15,auVar10);
                auVar20 = vpcmpgtd_avx2(auVar14,auVar11);
                *(undefined1 (*) [32])((long)*b + sVar32) = auVar14;
                *(undefined1 (*) [32])((long)*b_00 + sVar32) = auVar54;
                auVar19 = vblendvps_avx(auVar46,auVar54,auVar20);
                in_ZMM15 = ZEXT3264(auVar19);
                *(undefined1 (*) [32])((long)*b_01 + sVar32) = auVar56;
                local_b8 = vblendvps_avx(auVar47,auVar56,auVar20);
                local_1d8 = vblendvps_avx(auVar13,auVar12,auVar20);
                *(undefined1 (*) [32])((long)*b_02 + sVar32) = auVar12;
                *(undefined1 (*) [32])((long)*b_03 + sVar32) = auVar11;
                *(undefined1 (*) [32])((long)*b_04 + sVar32) = auVar46;
                *(undefined1 (*) [32])((long)*b_05 + sVar32) = auVar47;
                auVar19 = vpmaxsd_avx2(auVar14,auVar11);
                auVar55 = ZEXT3264(auVar19);
                *(undefined1 (*) [32])((long)*b_06 + sVar32) = auVar13;
                sVar32 = sVar32 + 0x20;
                auVar19 = auVar3;
                auVar46 = auVar53;
                auVar47 = auVar4;
                auVar20 = auVar5;
              }
              auVar19 = vperm2i128_avx2(auVar54,auVar54,0x28);
              auVar20 = vpalignr_avx2(auVar54,auVar19,0xc);
              auVar19 = vperm2i128_avx2(auVar56,auVar56,0x28);
              auVar54 = vpalignr_avx2(auVar56,auVar19,0xc);
              auVar19 = vperm2i128_avx2(local_b8,local_b8,0x28);
              local_b8 = vpalignr_avx2(local_b8,auVar19,0xc);
              auVar19 = vperm2i128_avx2(local_1d8,local_1d8,0x28);
              local_1d8 = vpalignr_avx2(local_1d8,auVar19,0xc);
              auVar19 = vpaddd_avx2(auVar20,(undefined1  [32])*ptr_03);
              auVar56 = vpcmpgtd_avx2(auVar15,auVar19);
              auVar15 = vpmaxsd_avx2(auVar15,auVar19);
              auVar19 = vblendvps_avx(auVar54,local_248,auVar56);
              auVar46 = vblendvps_avx(local_b8,local_288,auVar56);
              auVar47 = vpaddd_avx2(local_1d8,(undefined1  [32])*ptr_04);
              auVar47 = vblendvps_avx(auVar47,local_268,auVar56);
              iVar26 = 6;
              while( true ) {
                auVar56 = vperm2i128_avx2(auVar15,auVar15,0x28);
                auVar3 = vperm2i128_avx2(auVar19,auVar19,0x28);
                auVar53 = vperm2i128_avx2(auVar46,auVar46,0x28);
                auVar4 = vperm2i128_avx2(auVar47,auVar47,0x28);
                bVar37 = iVar26 == 0;
                iVar26 = iVar26 + -1;
                if (bVar37) break;
                auVar56 = vpalignr_avx2(auVar15,auVar56,0xc);
                auVar56 = vpaddd_avx2(auVar56,auVar39);
                auVar5 = vpcmpgtd_avx2(auVar15,auVar56);
                auVar3 = vpalignr_avx2(auVar19,auVar3,0xc);
                auVar19 = vblendvps_avx(auVar3,auVar19,auVar5);
                auVar15 = vpmaxsd_avx2(auVar15,auVar56);
                auVar56 = vpalignr_avx2(auVar46,auVar53,0xc);
                auVar46 = vblendvps_avx(auVar56,auVar46,auVar5);
                auVar56 = vpalignr_avx2(auVar47,auVar4,0xc);
                auVar56 = vpaddd_avx2(auVar56,auVar44);
                auVar47 = vblendvps_avx(auVar56,auVar47,auVar5);
              }
              auVar15 = vpalignr_avx2(auVar15,auVar56,0xc);
              auVar56 = vpaddd_avx2(auVar15,auVar40);
              auVar5 = vpcmpgtd_avx2(auVar56,auVar20);
              auVar15 = vpalignr_avx2(auVar19,auVar3,0xc);
              auVar19 = vblendvps_avx(auVar54,auVar15,auVar5);
              auVar12 = vpmaxsd_avx2(auVar56,auVar20);
              auVar20 = vpalignr_avx2(auVar46,auVar53,0xc);
              auVar46 = vblendvps_avx(local_b8,auVar20,auVar5);
              auVar3 = vpalignr_avx2(auVar47,auVar4,0xc);
              auVar47 = vblendvps_avx(local_1d8,auVar3,auVar5);
              for (sVar32 = 0; __n != sVar32; sVar32 = sVar32 + 0x20) {
                auVar53 = *(undefined1 (*) [32])((long)*b_03 + sVar32);
                auVar4._4_4_ = open;
                auVar4._0_4_ = open;
                auVar4._8_4_ = open;
                auVar4._12_4_ = open;
                auVar4._16_4_ = open;
                auVar4._20_4_ = open;
                auVar4._24_4_ = open;
                auVar4._28_4_ = open;
                auVar4 = vpsubd_avx2(auVar12,auVar4);
                auVar5._4_4_ = gap;
                auVar5._0_4_ = gap;
                auVar5._8_4_ = gap;
                auVar5._12_4_ = gap;
                auVar5._16_4_ = gap;
                auVar5._20_4_ = gap;
                auVar5._24_4_ = gap;
                auVar5._28_4_ = gap;
                auVar5 = vpsubd_avx2(auVar56,auVar5);
                auVar56 = vpmaxsd_avx2(auVar4,auVar5);
                auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
                auVar15 = vblendvps_avx(auVar15,auVar19,auVar4);
                auVar20 = vblendvps_avx(auVar20,auVar46,auVar4);
                auVar19 = vblendvps_avx(auVar3,auVar47,auVar4);
                auVar3 = vpsubd_avx2(auVar19,_DAT_008a5a80);
                auVar19 = vpmaxsd_avx2(auVar53,*(undefined1 (*) [32])((long)*b + sVar32));
                auVar4 = vpmaxsd_avx2(auVar19,auVar56);
                auVar12 = vpmaxsd_avx2(auVar4,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                auVar47 = vpcmpeqd_avx2(auVar12,auVar56);
                auVar19 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + sVar32),auVar15,auVar47
                                       );
                auVar46 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + sVar32),auVar20,auVar47
                                       );
                auVar47 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + sVar32),auVar3,auVar47)
                ;
                auVar53 = vpcmpeqd_avx2(auVar53,auVar12);
                auVar19 = vblendvps_avx(auVar19,*(undefined1 (*) [32])((long)*b_04 + sVar32),auVar53
                                       );
                auVar46 = vblendvps_avx(auVar46,*(undefined1 (*) [32])((long)*b_05 + sVar32),auVar53
                                       );
                auVar47 = vblendvps_avx(auVar47,*(undefined1 (*) [32])((long)*b_06 + sVar32),auVar53
                                       );
                auVar53._8_4_ = 1;
                auVar53._0_8_ = 0x100000001;
                auVar53._12_4_ = 1;
                auVar53._16_4_ = 1;
                auVar53._20_4_ = 1;
                auVar53._24_4_ = 1;
                auVar53._28_4_ = 1;
                auVar53 = vpcmpgtd_avx2(auVar53,auVar4);
                auVar19 = vpandn_avx2(auVar53,auVar19);
                auVar46 = vpandn_avx2(auVar53,auVar46);
                auVar47 = vpandn_avx2(auVar53,auVar47);
                *(undefined1 (*) [32])((long)*b_03 + sVar32) = auVar12;
                *(undefined1 (*) [32])((long)*b_04 + sVar32) = auVar19;
                *(undefined1 (*) [32])((long)*b_05 + sVar32) = auVar46;
                *(undefined1 (*) [32])((long)*b_06 + sVar32) = auVar47;
                auVar51 = vpmaxsd_avx2(auVar51,auVar12);
                auVar51 = vpmaxsd_avx2(auVar51,auVar19);
                auVar53 = vpmaxsd_avx2(auVar46,auVar47);
                auVar51 = vpmaxsd_avx2(auVar51,auVar53);
                auVar16 = vpminsd_avx2(auVar16,auVar12);
                auVar18 = vpmaxsd_avx2(auVar12,auVar18);
              }
              auVar19 = vpcmpgtd_avx2(auVar18,local_d8);
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar19 = vpermq_avx2(auVar18,0x44);
                auVar19 = vpmaxsd_avx2(auVar18,auVar19);
                auVar46 = vpslldq_avx2(auVar19,8);
                auVar19 = vpmaxsd_avx2(auVar19,auVar46);
                auVar46 = vpslldq_avx2(auVar19,4);
                auVar19 = vpmaxsd_avx2(auVar19,auVar46);
                iVar30 = auVar19._28_4_;
                auVar47._8_4_ = 7;
                auVar47._0_8_ = 0x700000007;
                auVar47._12_4_ = 7;
                auVar47._16_4_ = 7;
                auVar47._20_4_ = 7;
                auVar47._24_4_ = 7;
                auVar47._28_4_ = 7;
                local_d8 = vpermd_avx2(auVar47,auVar19);
                memcpy(ptr,b_03,__n);
                memcpy(ptr_00,b_04,__n);
                memcpy(ptr_01,b_05,__n);
                b_01 = ptr_05;
                b_00 = ptr_06;
                b = ptr_07;
                memcpy(ptr_02,b_06,__n);
                local_2cc = (int)uVar35;
                ptr_05 = b_01;
                ptr_06 = b_00;
                ptr_07 = b;
              }
              in_ZMM15 = ZEXT3264(auVar54);
            }
            uVar35 = 0;
            iVar26 = 0;
            iVar29 = 0;
            iVar31 = 0;
            while( true ) {
              iVar33 = (int)uVar23;
              if ((uVar34 & 0xfffffff) << 3 == (uint)uVar35) break;
              if ((*(int *)((long)*ptr + uVar35 * 4) == iVar30) &&
                 (uVar25 = ((uint)uVar35 & 7) * uVar34 + ((uint)(uVar35 >> 3) & 0x1fffffff),
                 (int)uVar25 < iVar33)) {
                iVar26 = *(int *)((long)*ptr_00 + uVar35 * 4);
                iVar29 = *(int *)((long)*ptr_01 + uVar35 * 4);
                iVar31 = *(int *)((long)*ptr_02 + uVar35 * 4);
                uVar23 = (ulong)uVar25;
              }
              uVar35 = uVar35 + 1;
            }
            auVar20._4_4_ = iVar21;
            auVar20._0_4_ = iVar21;
            auVar20._8_4_ = iVar21;
            auVar20._12_4_ = iVar21;
            auVar20._16_4_ = iVar21;
            auVar20._20_4_ = iVar21;
            auVar20._24_4_ = iVar21;
            auVar20._28_4_ = iVar21;
            auVar39 = vpcmpgtd_avx2(auVar20,auVar16);
            auVar3._4_4_ = iVar36;
            auVar3._0_4_ = iVar36;
            auVar3._8_4_ = iVar36;
            auVar3._12_4_ = iVar36;
            auVar3._16_4_ = iVar36;
            auVar3._20_4_ = iVar36;
            auVar3._24_4_ = iVar36;
            auVar3._28_4_ = iVar36;
            auVar44 = vpcmpgtd_avx2(auVar51,auVar3);
            auVar39 = vpor_avx2(auVar44,auVar39);
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0x7f,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0xbf,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar39[0x1f] < '\0') {
              *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
              iVar30 = 0;
              iVar26 = 0;
              iVar29 = 0;
              iVar31 = 0;
              local_2cc = 0;
              iVar33 = 0;
            }
            ppVar24->score = iVar30;
            ppVar24->end_query = iVar33;
            ppVar24->end_ref = local_2cc;
            ((ppVar24->field_4).stats)->matches = iVar26;
            ((ppVar24->field_4).stats)->similar = iVar29;
            ((ppVar24->field_4).stats)->length = iVar31;
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(ptr_05);
            parasail_free(ptr_06);
            parasail_free(ptr_07);
            return ppVar24;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar28 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_scan_profile_avx2_256_32",pcVar28);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile32.score;
    pvPm = (__m256i*)profile->profile32.matches;
    pvPs = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi32(segLen), 4);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
            vGapperL = _mm256_add_epi32(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHpM = _mm256_slli_si256_rpl(vHpM, 4);
        vHpS = _mm256_slli_si256_rpl(vHpS, 4);
        vHpL = _mm256_slli_si256_rpl(vHpL, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi32(vH, vGapO);
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            case1 = _mm256_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm256_max_epi32(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi32(vEL, vOne);
            vGapper = _mm256_add_epi32(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vF, vGapper),
                    _mm256_cmpeq_epi32(vF, vGapper));
            vF = _mm256_max_epi32(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi32(vHp, vW);
            vHpM = _mm256_add_epi32(vHpM, vWM);
            vHpS = _mm256_add_epi32(vHpS, vWS);
            vHpL = _mm256_add_epi32(vHpL, vOne);
            case1 = _mm256_cmpgt_epi32(vE, vHp);
            vHt = _mm256_max_epi32(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHtM = _mm256_slli_si256_rpl(vHtM, 4);
        vHtS = _mm256_slli_si256_rpl(vHtS, 4);
        vHtL = _mm256_slli_si256_rpl(vHtL, 4);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi32(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi32(vGapper, vF),
                _mm256_cmpeq_epi32(vGapper, vF));
        vF = _mm256_max_epi32(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 4);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 4);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vFt, vF),
                    _mm256_cmpeq_epi32(vFt, vF));
            vF = _mm256_max_epi32(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vFM = _mm256_slli_si256_rpl(vFM, 4);
        vFS = _mm256_slli_si256_rpl(vFS, 4);
        vFL = _mm256_slli_si256_rpl(vFL, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi32(vF, vHt);
        vH = _mm256_max_epi32(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi32(vH, vGapO);
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi32(vFL, vOne);
            vH = _mm256_max_epi32(vHp, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            case1 = _mm256_cmpeq_epi32(vH, vHp);
            case2 = _mm256_cmpeq_epi32(vH, vF);
            case0 = _mm256_cmpeq_epi32(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi32(vH, vMaxH);
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t *m = (int32_t*)pvHMMax;
        int32_t *s = (int32_t*)pvHSMax;
        int32_t *l = (int32_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}